

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.cpp
# Opt level: O0

char * macro_GetAllArgs(void)

{
  size_t sVar1;
  int *piVar2;
  char *pcVar3;
  undefined1 *puVar4;
  size_t n;
  undefined1 *puStack_30;
  uint32_t i_1;
  char *ptr;
  char *str;
  long lStack_18;
  uint32_t i;
  size_t len;
  
  if (macroArgs == (MacroArgs *)0x0) {
    len = 0;
  }
  else if (macroArgs->shift < macroArgs->nbArgs) {
    lStack_18 = 0;
    for (str._4_4_ = macroArgs->shift; str._4_4_ < macroArgs->nbArgs; str._4_4_ = str._4_4_ + 1) {
      sVar1 = strlen(*(char **)(&macroArgs[1].nbArgs + (ulong)str._4_4_ * 2));
      lStack_18 = sVar1 + 1 + lStack_18;
    }
    len = (size_t)malloc(lStack_18 + 1);
    if ((undefined1 *)len == (undefined1 *)0x0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fatalerror("Failed to allocate memory for expanding \'\\#\': %s\n",pcVar3);
    }
    puStack_30 = (undefined1 *)len;
    for (n._4_4_ = macroArgs->shift; n._4_4_ < macroArgs->nbArgs; n._4_4_ = n._4_4_ + 1) {
      sVar1 = strlen(*(char **)(&macroArgs[1].nbArgs + (ulong)n._4_4_ * 2));
      memcpy(puStack_30,*(void **)(&macroArgs[1].nbArgs + (ulong)n._4_4_ * 2),sVar1);
      puVar4 = puStack_30 + sVar1;
      if ((n._4_4_ < macroArgs->nbArgs - 1) || (puStack_30 = puVar4, sVar1 == 0)) {
        puStack_30 = puVar4 + 1;
        *puVar4 = 0x2c;
      }
    }
    *puStack_30 = 0;
  }
  else {
    len = (long)
          "Internal error: fstack node #%u follows #%u. Please report this to the developers!\n" +
          0x53;
  }
  return (char *)len;
}

Assistant:

char const *macro_GetAllArgs(void)
{
	if (!macroArgs)
		return NULL;

	if (macroArgs->shift >= macroArgs->nbArgs)
		return "";

	size_t len = 0;

	for (uint32_t i = macroArgs->shift; i < macroArgs->nbArgs; i++)
		len += strlen(macroArgs->args[i]) + 1; // 1 for comma

	char *str = (char *)malloc(len + 1); // 1 for '\0'
	char *ptr = str;

	if (!str)
		fatalerror("Failed to allocate memory for expanding '\\#': %s\n", strerror(errno));

	for (uint32_t i = macroArgs->shift; i < macroArgs->nbArgs; i++) {
		size_t n = strlen(macroArgs->args[i]);

		memcpy(ptr, macroArgs->args[i], n);
		ptr += n;

		// Commas go between args and after a last empty arg
		if (i < macroArgs->nbArgs - 1 || n == 0)
			*ptr++ = ','; // no space after comma
	}
	*ptr = '\0';

	return str;
}